

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::solve_equality
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double> *this)

{
  longdouble lVar1;
  uint uVar2;
  pointer piVar3;
  pointer pcVar4;
  longdouble lVar5;
  pointer piVar6;
  pointer pnVar7;
  ptrdiff_t _Num;
  long lVar8;
  ulong uVar9;
  longdouble lVar10;
  
  piVar6 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar3 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->lower_bound = (longdouble)INFINITY;
  lVar10 = (longdouble)0;
  lVar8 = (long)piVar3 - (long)piVar6;
  if (lVar8 != 0) {
    lVar5 = (longdouble)0;
    lVar8 = (lVar8 >> 4) * -0x5555555555555555;
    lVar10 = lVar5;
    do {
      lVar1 = piVar6->r;
      if (lVar1 <= lVar5 || lVar5 != lVar1) {
        lVar10 = lVar1 + lVar10;
      }
      piVar6 = piVar6 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  this->upper_bound = lVar10;
  make_init_node_0(this);
  pnVar7 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pnVar7[-1].sumfactor == this->b_min) {
    this->upper_bound = pnVar7[-1].sumr;
    uVar9 = (ulong)(this->subvector).m_element_size;
    if (uVar9 != 0) {
      pcVar4 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar4 + this->solution,pcVar4 + pnVar7[-1].variables,uVar9);
      pnVar7 = (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    uVar2 = pnVar7[-1].variables;
    shared_subvector::check_index(&this->subvector,uVar2);
    *(size_type *)
     ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start + uVar2) = (this->subvector).m_free_list_head;
    (this->subvector).m_free_list_head = uVar2;
  }
  else {
    make_init_node_1(this);
    pnVar7 = (this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pnVar7[-1].sumfactor == this->b_min) {
      this->upper_bound = pnVar7[-1].sumr;
      uVar9 = (ulong)(this->subvector).m_element_size;
      if (uVar9 != 0) {
        pcVar4 = (this->subvector).m_container.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memmove(pcVar4 + this->solution,pcVar4 + pnVar7[-1].variables,uVar9);
        pnVar7 = (this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar2 = pnVar7[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar2);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar2) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar2;
      pnVar7 = (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->nodes).
      super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
      ._M_impl.super__Vector_impl_data._M_finish = pnVar7;
    }
    if ((this->nodes).
        super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
        ._M_impl.super__Vector_impl_data._M_start != pnVar7) {
      do {
        make_next_equality_node(this);
      } while ((this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void solve_equality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            return;
        }

        make_init_node_1();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_equality_node();
    }